

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O1

void mbedtls_debug_print_msg
               (mbedtls_ssl_context *ssl,int level,char *file,int line,char *format,...)

{
  char in_AL;
  uint uVar1;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  char str [512];
  undefined8 local_2f8;
  void **local_2f0;
  undefined1 *local_2e8;
  undefined1 local_2d8 [40];
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  char local_228 [520];
  
  if (in_AL != '\0') {
    local_2a8 = in_XMM0_Qa;
    local_298 = in_XMM1_Qa;
    local_288 = in_XMM2_Qa;
    local_278 = in_XMM3_Qa;
    local_268 = in_XMM4_Qa;
    local_258 = in_XMM5_Qa;
    local_248 = in_XMM6_Qa;
    local_238 = in_XMM7_Qa;
  }
  if (((ssl->conf != (mbedtls_ssl_config *)0x0) &&
      (ssl->conf->f_dbg != (_func_void_void_ptr_int_char_ptr_int_char_ptr *)0x0)) &&
     (level <= debug_threshold)) {
    local_2e8 = local_2d8;
    local_2f0 = &argp[0].overflow_arg_area;
    local_2f8 = 0x3000000028;
    local_2b0 = in_R9;
    uVar1 = vsnprintf(local_228,0x200,format,&local_2f8);
    if (uVar1 < 0x1ff) {
      (local_228 + uVar1)[0] = '\n';
      (local_228 + uVar1)[1] = '\0';
    }
    (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_228);
  }
  return;
}

Assistant:

void mbedtls_debug_print_msg( const mbedtls_ssl_context *ssl, int level,
                              const char *file, int line,
                              const char *format, ... )
{
    va_list argp;
    char str[DEBUG_BUF_SIZE];
    int ret;

    if( ssl->conf == NULL || ssl->conf->f_dbg == NULL || level > debug_threshold )
        return;

    va_start( argp, format );
#if defined(_WIN32)
#if defined(_TRUNCATE)
    ret = _vsnprintf_s( str, DEBUG_BUF_SIZE, _TRUNCATE, format, argp );
#else
    ret = _vsnprintf( str, DEBUG_BUF_SIZE, format, argp );
    if( ret < 0 || (size_t) ret == DEBUG_BUF_SIZE )
    {
        str[DEBUG_BUF_SIZE-1] = '\0';
        ret = -1;
    }
#endif
#else
    ret = vsnprintf( str, DEBUG_BUF_SIZE, format, argp );
#endif
    va_end( argp );

    if( ret >= 0 && ret < DEBUG_BUF_SIZE - 1 )
    {
        str[ret]     = '\n';
        str[ret + 1] = '\0';
    }

    debug_send_line( ssl, level, file, line, str );
}